

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localpointer.h
# Opt level: O2

void __thiscall
icu_63::LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInsteadAndCheckErrorCode
          (LocalPointer<const_icu_63::DecimalFormatSymbols> *this,DecimalFormatSymbols *p,
          UErrorCode *errorCode)

{
  DecimalFormatSymbols *pDVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pDVar1 = (this->super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>).ptr;
    if (pDVar1 != (DecimalFormatSymbols *)0x0) {
      (*(pDVar1->super_UObject)._vptr_UObject[1])();
    }
    (this->super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>).ptr = p;
    if (p == (DecimalFormatSymbols *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  else if (p != (DecimalFormatSymbols *)0x0) {
    (*(p->super_UObject)._vptr_UObject[1])(p);
    return;
  }
  return;
}

Assistant:

void adoptInsteadAndCheckErrorCode(T *p, UErrorCode &errorCode) {
        if(U_SUCCESS(errorCode)) {
            delete LocalPointerBase<T>::ptr;
            LocalPointerBase<T>::ptr=p;
            if(p==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
            }
        } else {
            delete p;
        }
    }